

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::filetest::~filetest(filetest *this)

{
  filetest *this_local;
  
  ~filetest(this);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      TEST_EQ("#f", run("(file-exists? \"asdfjwedsfsde\")"));
#ifdef _WIN32
      TEST_EQ("#t", run("(file-exists?  \"data\\\\include_test_1.scm\")"));
#else
      TEST_EQ("#t", run("(file-exists?  \"./data/include_test_1.scm\")"));
#endif
      }